

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

EVdfg_stone INT_EVdfg_create_sink_stone(EVdfg dfg,char *sink_name)

{
  size_t sVar1;
  char *__dest;
  EVdfg_stone p_Var2;
  char *in_RSI;
  char *act;
  size_t len;
  EVdfg_stone tmp;
  char *in_stack_00000028;
  EVdfg in_stack_00000030;
  
  sVar1 = strlen(in_RSI);
  __dest = (char *)INT_CMmalloc(sVar1 + 5);
  strcpy(__dest,"sink:");
  strcat(__dest,in_RSI);
  p_Var2 = INT_EVdfg_create_stone(in_stack_00000030,in_stack_00000028);
  free(__dest);
  return p_Var2;
}

Assistant:

EVdfg_stone
INT_EVdfg_create_sink_stone(EVdfg dfg, char *sink_name)
{
    EVdfg_stone tmp;
    size_t len = strlen(sink_name) + strlen("sink:");
    char *act = malloc(len + 1);
    strcpy(&act[0], "sink:");
    strcat(&act[0], sink_name);
    tmp = INT_EVdfg_create_stone(dfg, &act[0]);
    free(act);
    return tmp;
}